

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O0

bool __thiscall
tfeedback_decl::assign_location(tfeedback_decl *this,gl_context *ctx,gl_shader_program *prog)

{
  bool bVar1;
  uint uVar2;
  glsl_type *this_00;
  int iVar3;
  uint uVar4;
  int local_64;
  uint local_60;
  uint local_5c;
  uint struct_offset;
  uint array_offset;
  uint array_elem_size;
  uint actual_array_size;
  uint vector_elements;
  uint matrix_cols;
  uint dmul;
  uint fine_location;
  gl_shader_program *prog_local;
  gl_context *ctx_local;
  tfeedback_decl *this_local;
  
  bVar1 = is_varying(this);
  if (!bVar1) {
    __assert_fail("this->is_varying()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                  ,0x418,
                  "bool tfeedback_decl::assign_location(struct gl_context *, struct gl_shader_program *)"
                 );
  }
  matrix_cols = (this->matched_candidate->toplevel_var->data).location * 4 +
                (*(uint *)&this->matched_candidate->toplevel_var->data >> 0x1d & 3) +
                this->matched_candidate->offset;
  this_00 = glsl_type::without_array(this->matched_candidate->type);
  bVar1 = glsl_type::is_64bit(this_00);
  iVar3 = 1;
  if (bVar1) {
    iVar3 = 2;
  }
  bVar1 = glsl_type::is_array(this->matched_candidate->type);
  if (bVar1) {
    uVar2 = (uint)((this->matched_candidate->type->fields).array)->matrix_columns;
    uVar4 = (uint)((this->matched_candidate->type->fields).array)->vector_elements;
    switch(this->lowered_builtin_array_variable) {
    case none:
    default:
      array_offset = glsl_type::array_size(this->matched_candidate->type);
      break;
    case clip_distance:
      if (prog->last_vert_prog == (gl_program *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = *(uint *)&(prog->last_vert_prog->info).field_0x76 & 0xf;
      }
      array_offset = local_5c;
      break;
    case cull_distance:
      if (prog->last_vert_prog == (gl_program *)0x0) {
        local_60 = 0;
      }
      else {
        local_60 = *(uint *)&(prog->last_vert_prog->info).field_0x76 >> 4 & 0xf;
      }
      array_offset = local_60;
      break;
    case tess_level_outer:
      array_offset = 4;
      break;
    case tess_level_inner:
      array_offset = 2;
    }
    if ((this->is_subscripted & 1U) == 0) {
      this->size = array_offset;
    }
    else {
      if (array_offset <= this->array_subscript) {
        linker_error(prog,"Transform feedback varying %s has index %i, but the array size is %u.",
                     this->orig_name,(ulong)this->array_subscript,(ulong)array_offset);
        return false;
      }
      if (this->lowered_builtin_array_variable == none) {
        local_64 = uVar4 * uVar2 * iVar3;
      }
      else {
        local_64 = 1;
      }
      matrix_cols = local_64 * this->array_subscript + matrix_cols;
      this->size = 1;
    }
    this->vector_elements = uVar4;
    this->matrix_columns = uVar2;
    if (this->lowered_builtin_array_variable == none) {
      this->type = ((this->matched_candidate->type->fields).array)->gl_type;
    }
    else {
      this->type = 0x1406;
    }
  }
  else {
    if ((this->is_subscripted & 1U) != 0) {
      linker_error(prog,"Transform feedback varying %s requested, but %s is not an array.",
                   this->orig_name,this->var_name);
      return false;
    }
    this->size = 1;
    this->vector_elements = (uint)this->matched_candidate->type->vector_elements;
    this->matrix_columns = (uint)this->matched_candidate->type->matrix_columns;
    this->type = this->matched_candidate->type->gl_type;
  }
  this->location = matrix_cols >> 2;
  this->location_frac = matrix_cols & 3;
  if (((prog->TransformFeedback).BufferMode == 0x8c8d) &&
     (uVar2 = num_components(this), (ctx->Const).MaxTransformFeedbackSeparateComponents < uVar2)) {
    linker_error(prog,
                 "Transform feedback varying %s exceeds MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS."
                 ,this->orig_name);
    this_local._7_1_ = false;
  }
  else {
    this->stream_id = (this->matched_candidate->toplevel_var->data).stream;
    uVar2 = this->matched_candidate->offset;
    this->buffer = (this->matched_candidate->toplevel_var->data).xfb_buffer;
    this->offset = (this->matched_candidate->toplevel_var->data).offset +
                   this->array_subscript * 4 * iVar3 + uVar2 * 4 * iVar3;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
tfeedback_decl::assign_location(struct gl_context *ctx,
                                struct gl_shader_program *prog)
{
   assert(this->is_varying());

   unsigned fine_location
      = this->matched_candidate->toplevel_var->data.location * 4
      + this->matched_candidate->toplevel_var->data.location_frac
      + this->matched_candidate->offset;
   const unsigned dmul =
      this->matched_candidate->type->without_array()->is_64bit() ? 2 : 1;

   if (this->matched_candidate->type->is_array()) {
      /* Array variable */
      const unsigned matrix_cols =
         this->matched_candidate->type->fields.array->matrix_columns;
      const unsigned vector_elements =
         this->matched_candidate->type->fields.array->vector_elements;
      unsigned actual_array_size;
      switch (this->lowered_builtin_array_variable) {
      case clip_distance:
         actual_array_size = prog->last_vert_prog ?
            prog->last_vert_prog->info.clip_distance_array_size : 0;
         break;
      case cull_distance:
         actual_array_size = prog->last_vert_prog ?
            prog->last_vert_prog->info.cull_distance_array_size : 0;
         break;
      case tess_level_outer:
         actual_array_size = 4;
         break;
      case tess_level_inner:
         actual_array_size = 2;
         break;
      case none:
      default:
         actual_array_size = this->matched_candidate->type->array_size();
         break;
      }

      if (this->is_subscripted) {
         /* Check array bounds. */
         if (this->array_subscript >= actual_array_size) {
            linker_error(prog, "Transform feedback varying %s has index "
                         "%i, but the array size is %u.",
                         this->orig_name, this->array_subscript,
                         actual_array_size);
            return false;
         }
         unsigned array_elem_size = this->lowered_builtin_array_variable ?
            1 : vector_elements * matrix_cols * dmul;
         fine_location += array_elem_size * this->array_subscript;
         this->size = 1;
      } else {
         this->size = actual_array_size;
      }
      this->vector_elements = vector_elements;
      this->matrix_columns = matrix_cols;
      if (this->lowered_builtin_array_variable)
         this->type = GL_FLOAT;
      else
         this->type = this->matched_candidate->type->fields.array->gl_type;
   } else {
      /* Regular variable (scalar, vector, or matrix) */
      if (this->is_subscripted) {
         linker_error(prog, "Transform feedback varying %s requested, "
                      "but %s is not an array.",
                      this->orig_name, this->var_name);
         return false;
      }
      this->size = 1;
      this->vector_elements = this->matched_candidate->type->vector_elements;
      this->matrix_columns = this->matched_candidate->type->matrix_columns;
      this->type = this->matched_candidate->type->gl_type;
   }
   this->location = fine_location / 4;
   this->location_frac = fine_location % 4;

   /* From GL_EXT_transform_feedback:
    *   A program will fail to link if:
    *
    *   * the total number of components to capture in any varying
    *     variable in <varyings> is greater than the constant
    *     MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS_EXT and the
    *     buffer mode is SEPARATE_ATTRIBS_EXT;
    */
   if (prog->TransformFeedback.BufferMode == GL_SEPARATE_ATTRIBS &&
       this->num_components() >
       ctx->Const.MaxTransformFeedbackSeparateComponents) {
      linker_error(prog, "Transform feedback varying %s exceeds "
                   "MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS.",
                   this->orig_name);
      return false;
   }

   /* Only transform feedback varyings can be assigned to non-zero streams,
    * so assign the stream id here.
    */
   this->stream_id = this->matched_candidate->toplevel_var->data.stream;

   unsigned array_offset = this->array_subscript * 4 * dmul;
   unsigned struct_offset = this->matched_candidate->offset * 4 * dmul;
   this->buffer = this->matched_candidate->toplevel_var->data.xfb_buffer;
   this->offset = this->matched_candidate->toplevel_var->data.offset +
      array_offset + struct_offset;

   return true;
}